

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

CRef __thiscall
Gluco::ClauseAllocator::alloc<Gluco::vec<Gluco::Lit>>
          (ClauseAllocator *this,vec<Gluco::Lit> *ps,bool learnt)

{
  bool use_extra;
  Ref r;
  Clause *this_00;
  
  use_extra = (bool)((this->super_RegionAllocator<unsigned_int>).field_0x14 | learnt);
  r = RegionAllocator<unsigned_int>::alloc
                (&this->super_RegionAllocator<unsigned_int>,ps->sz + (uint)use_extra + 3);
  this_00 = (Clause *)
            RegionAllocator<unsigned_int>::lea(&this->super_RegionAllocator<unsigned_int>,r);
  Clause::Clause<Gluco::vec<Gluco::Lit>>(this_00,ps,use_extra,learnt);
  return r;
}

Assistant:

CRef alloc(const Lits& ps, bool learnt = false)
    {
        assert(sizeof(Lit)      == sizeof(uint32_t));
        assert(sizeof(float)    == sizeof(uint32_t));
        bool use_extra = learnt | extra_clause_field;

        CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), use_extra));
        new (lea(cid)) Clause(ps, use_extra, learnt);

        return cid;
    }